

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::outputFinalRegTupleString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,
          bitset<7UL> *increasing,size_t stringOffset)

{
  size_t sVar1;
  ulong uVar2;
  string k;
  string aggString;
  string aggIDString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  ulong local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  size_t local_88;
  CppGenerator *local_80;
  size_t local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_a8);
  local_88 = numOfAggs;
  if (numOfAggs < 3) {
    local_b0 = 0;
    local_80 = this;
    local_78 = stringOffset;
    while( true ) {
      if (local_88 < local_b0) break;
      uVar2 = (long)((increasing->super__Base_bitset<1UL>)._M_w << 0x3b) >> 0x3f & local_b0;
      sVar1 = idx->indexes[4];
      offset_abi_cxx11_(&local_70,local_80,local_78);
      std::operator+(&local_d0,&local_70,"aggregates_");
      std::operator+(&local_110,&local_d0,local_80->viewName + idx->indexes[3]);
      std::operator+(&local_130,&local_110,"[");
      std::__cxx11::to_string(&local_50,uVar2 + sVar1);
      std::operator+(&local_f0,&local_130,&local_50);
      std::operator+(&local_a8,&local_f0,"] += ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_f0);
      uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
      if ((uVar2 & 1) != 0) {
        std::__cxx11::to_string
                  (&local_110,
                   (-(ulong)((uint)(increasing->super__Base_bitset<1UL>)._M_w & 1) & local_b0) +
                   idx->indexes[0]);
        std::operator+(&local_130,"aggregateRegister[",&local_110);
        std::operator+(&local_f0,&local_130,"]*");
        std::__cxx11::string::append((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar2 & 2) != 0) {
        std::__cxx11::to_string
                  (&local_110,
                   ((long)((increasing->super__Base_bitset<1UL>)._M_w << 0x3e) >> 0x3f & local_b0) +
                   idx->indexes[1]);
        std::operator+(&local_130,"postRegister[",&local_110);
        std::operator+(&local_f0,&local_130,"]*");
        std::__cxx11::string::append((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar2 & 4) != 0) {
        std::__cxx11::to_string
                  (&local_110,
                   ((long)((increasing->super__Base_bitset<1UL>)._M_w << 0x3d) >> 0x3f & local_b0) +
                   idx->indexes[2]);
        std::operator+(&local_130,"aggregateRegister[",&local_110);
        std::operator+(&local_f0,&local_130,"]*");
        std::__cxx11::string::append((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
      }
      if (local_a8._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&local_a8);
      }
      else {
        std::__cxx11::string::pop_back();
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a8);
      local_b0 = local_b0 + 1;
    }
  }
  else {
    offset_abi_cxx11_(&local_110,this,stringOffset);
    std::operator+(&local_130,&local_110,"for (size_t i = 0; i < ");
    std::__cxx11::to_string(&local_d0,local_88 + 1);
    std::operator+(&local_f0,&local_130,&local_d0);
    std::operator+(&local_a8,&local_f0,";++i)\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::to_string(&local_a8,idx->indexes[4]);
    if (((increasing->super__Base_bitset<1UL>)._M_w & 0x10) != 0) {
      std::__cxx11::string::append((char *)&local_a8);
    }
    offset_abi_cxx11_(&local_50,this,stringOffset + 1);
    std::operator+(&local_70,&local_50,"aggregates_");
    std::operator+(&local_d0,&local_70,this->viewName + idx->indexes[3]);
    std::operator+(&local_110,&local_d0,"[");
    std::operator+(&local_130,&local_110,&local_a8);
    std::operator+(&local_f0,&local_130,"] += ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_130);
    uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
    if ((uVar2 & 1) != 0) {
      std::__cxx11::to_string(&local_130,idx->indexes[0]);
      if (((increasing->super__Base_bitset<1UL>)._M_w & 1) != 0) {
        std::__cxx11::string::append((char *)&local_130);
      }
      std::operator+(&local_d0,"aggregateRegister[",&local_130);
      std::operator+(&local_110,&local_d0,"]*");
      std::__cxx11::string::append((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_130);
      uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
    }
    if ((uVar2 & 2) != 0) {
      std::__cxx11::to_string(&local_130,idx->indexes[1]);
      if (((increasing->super__Base_bitset<1UL>)._M_w & 2) != 0) {
        std::__cxx11::string::append((char *)&local_130);
      }
      std::operator+(&local_d0,"postRegister[",&local_130);
      std::operator+(&local_110,&local_d0,"]*");
      std::__cxx11::string::append((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_130);
      uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
    }
    if ((uVar2 & 4) != 0) {
      std::__cxx11::to_string(&local_130,idx->indexes[2]);
      if (((increasing->super__Base_bitset<1UL>)._M_w & 4) != 0) {
        std::__cxx11::string::append((char *)&local_130);
      }
      std::operator+(&local_d0,"aggregateRegister[",&local_130);
      std::operator+(&local_110,&local_d0,"]*");
      std::__cxx11::string::append((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_130);
    }
    if (local_f0._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_f0);
    }
    else {
      std::__cxx11::string::pop_back();
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::outputFinalRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset)
{
    std::string outString = "";
    
    if (numOfAggs > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";

        std::string aggIDString = std::to_string(idx.indexes[4]);
        if (increasing[4])
            aggIDString += "+i";
        
        outString += offset(stringOffset+1)+"aggregates_"+viewName[idx.indexes[3]]+
            "["+aggIDString+"] += ";

        std::string aggString = "";
        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            aggString +="aggregateRegister["+k+"]*";
        }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            aggString +="postRegister["+k+"]*";
        }

        if (idx.present[2])
        {
            std::string k = std::to_string(idx.indexes[2]);
            if (increasing[2])
                k += "+i";
            aggString +="aggregateRegister["+k+"]*";
        }

        if (aggString.empty())
        {
            // std::cout << "aggString is empty - compressed!\n";
            aggString = "1*";
        }
        else
            aggString.pop_back();
        
        outString += aggString;
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            size_t aggID = idx.indexes[4];
            if (increasing[4])
                aggID += i;
        
            // We use a mapping to the correct index
            outString += offset(stringOffset)+"aggregates_"+viewName[idx.indexes[3]]+
                "["+std::to_string(aggID)+"] += ";

            std::string aggString = "";
            
            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                aggString +="aggregateRegister["+std::to_string(k)+"]*";
            }
            
            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                aggString +="postRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[2])
            {
                size_t k = idx.indexes[2];
                if (increasing[2])
                    k += i;
                aggString +="aggregateRegister["+std::to_string(k)+"]*";
            }

            if (aggString.empty())
            {
                // std::cout << "aggString is empty --- non-compressed !\n";
                aggString = "1";
            }
            else
                aggString.pop_back();
        
            outString += aggString;
            outString += ";\n";
        }
    }

    return outString;
}